

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void Engine::retrieve_assumption_nogood(vec<BoolView> *xs)

{
  Lit LVar1;
  anon_union_8_2_743a5d44_for_Reason_0 aVar2;
  Reason *pRVar3;
  Clause *pCVar4;
  vec<BoolView> *this;
  ulong uVar5;
  anon_union_8_2_743a5d44_for_Reason_0 aVar6;
  anon_union_8_2_743a5d44_for_Reason_0 aVar7;
  uint uVar8;
  uint uVar9;
  vec<Lit> *pvVar10;
  ulong uVar11;
  long lVar12;
  Lit *elem;
  vec<Lit> *this_00;
  uint uVar13;
  uint uVar15;
  int iVar16;
  Lit p;
  Lit local_80;
  Lit local_7c;
  undefined1 local_78 [8];
  Lit *pLStack_70;
  vec<Lit> local_68;
  vec<Lit> *local_58;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  Lit local_44;
  ulong local_40;
  vec<BoolView> *local_38;
  ulong uVar14;
  
  local_68.sz = 0;
  local_68.cap = 0;
  local_68.data = (Lit *)0x0;
  uVar13 = sat.trail.sz - 1;
  uVar14 = (ulong)uVar13;
  uVar9 = engine.assumptions.data[uVar14];
  if (0 < (int)uVar13) {
    uVar5 = 0;
    do {
      sat.seen.data[(uint)(engine.assumptions.data[uVar5] >> 1)] = '\x02';
      uVar5 = uVar5 + 1;
    } while (uVar14 != uVar5);
  }
  local_78 = (undefined1  [8])(CONCAT44(local_78._4_4_,uVar9) ^ 1);
  local_44.x = uVar9;
  local_38 = xs;
  vec<Lit>::push(&local_68,(Lit *)local_78);
  pCVar4 = sat.short_expl;
  pRVar3 = sat.reason.data;
  local_78 = (undefined1  [8])0x0;
  pLStack_70 = (Lit *)0x0;
  uVar15 = (int)uVar9 >> 1;
  if (-1 < sat.trailpos.data[uVar15]) {
    aVar6 = (anon_union_8_2_743a5d44_for_Reason_0)sat.reason.data[uVar15].field_0._pt;
    uVar8 = aVar6._0_4_ & 3;
    if ((aVar6._a & 3) != 0) {
      if (uVar8 == 1) {
        SAT::btToPos(&sat,sat.index,sat.trailpos.data[uVar15]);
        aVar6._pt = SAT::_getExpl(&sat,(Lit)(uVar9 ^ 1));
      }
      else {
        *(uint *)sat.short_expl = uVar8 << 8 | (uint)*(byte *)sat.short_expl;
        *(uint *)(pCVar4 + 1) = *(uint *)&pRVar3[uVar15].field_0 >> 2;
        aVar6._pt = sat.short_expl;
        if (uVar8 == 3) {
          pCVar4[1].data[0].x = *(int *)((long)&pRVar3[uVar15].field_0 + 4);
          aVar6._pt = sat.short_expl;
        }
      }
    }
    if (aVar6._pt == (Clause *)0x0) {
      vec<Lit>::push(&local_68,&local_44);
    }
    else {
      uVar9 = *(uint *)aVar6._pt;
      if (0x1ff < uVar9) {
        iVar16 = 0;
        uVar5 = 1;
        do {
          if (uVar9 >> 8 <= uVar5) {
LAB_001b71b6:
            abort();
          }
          local_80.x = (aVar6._pt)->data[uVar5].x;
          sat.seen.data[(uint)(local_80.x >> 1)] = sat.seen.data[(uint)(local_80.x >> 1)] | 1;
          if (sat.trailpos.data[(uint)(local_80.x >> 1)] < 0) {
            vec<Lit>::push((vec<Lit> *)local_78,&local_80);
          }
          else {
            iVar16 = iVar16 + 1;
          }
          uVar5 = uVar5 + 1;
          uVar9 = *(uint *)aVar6._pt;
        } while (uVar5 < uVar9 >> 8);
        if (iVar16 != 0) {
          local_50 = (anon_union_8_2_743a5d44_for_Reason_0)sat.reason.data[uVar15].field_0._pt;
          uVar5 = (ulong)(sat.trail.sz - 1);
          while (0 < (int)uVar5) {
            sat.index = sat.trail.data[uVar5].sz;
            uVar11 = (ulong)(uint)sat.index;
            local_40 = uVar5;
            if (sat.index != 0) {
              pvVar10 = sat.trail.data + uVar5;
              local_58 = pvVar10;
              do {
                pCVar4 = sat.short_expl;
                pRVar3 = sat.reason.data;
                sat.index = (int)uVar11 - 1;
                uVar11 = (ulong)(uint)sat.index;
                LVar1.x = pvVar10->data[uVar11].x;
                uVar9 = LVar1.x >> 1;
                if ((sat.seen.data[uVar9] & 1U) != 0) {
                  iVar16 = iVar16 + -1;
                  local_80.x = LVar1.x;
                  if ((sat.seen.data[uVar9] & 2U) == 0) {
                    vec<Lit>::push((vec<Lit> *)local_78,&local_80);
                    LVar1.x = local_80.x;
                    pCVar4 = sat.short_expl;
                    pRVar3 = sat.reason.data;
                    uVar9 = local_80.x >> 1;
                    aVar2 = (anon_union_8_2_743a5d44_for_Reason_0)sat.reason.data[uVar9].field_0._pt
                    ;
                    pvVar10 = local_58;
                    aVar6 = local_50;
                    if (local_50._pt != aVar2._pt) {
                      uVar15 = (uint)aVar2._a & 3;
                      aVar7 = aVar2;
                      if ((aVar2._a & 3) != 0) {
                        if (uVar15 == 1) {
                          SAT::btToPos(&sat,sat.index,sat.trailpos.data[uVar9]);
                          aVar7._pt = SAT::_getExpl(&sat,LVar1);
                        }
                        else {
                          *(uint *)sat.short_expl = uVar15 << 8 | (uint)*(byte *)sat.short_expl;
                          *(uint *)(pCVar4 + 1) = *(uint *)&pRVar3[uVar9].field_0 >> 2;
                          aVar7._pt = sat.short_expl;
                          if (uVar15 == 3) {
                            pCVar4[1].data[0].x = *(int *)((long)&pRVar3[uVar9].field_0 + 4);
                            aVar7._pt = sat.short_expl;
                          }
                        }
                      }
                      uVar9 = *(uint *)aVar7._pt;
                      pvVar10 = local_58;
                      aVar6 = aVar2;
                      if (0x1ff < uVar9) {
                        uVar5 = 1;
                        do {
                          if (uVar9 >> 8 <= uVar5) goto LAB_001b71b6;
                          local_7c.x = (aVar7._pt)->data[uVar5].x;
                          uVar9 = local_7c.x >> 1;
                          if ((sat.seen.data[uVar9] & 1U) == 0) {
                            sat.seen.data[uVar9] = sat.seen.data[uVar9] | 1;
                            if (sat.trailpos.data[uVar9] < 0) {
                              vec<Lit>::push((vec<Lit> *)local_78,&local_7c);
                            }
                            else {
                              iVar16 = iVar16 + 1;
                            }
                          }
                          uVar5 = uVar5 + 1;
                          uVar9 = *(uint *)aVar7._pt;
                          pvVar10 = local_58;
                        } while (uVar5 < uVar9 >> 8);
                      }
                    }
                  }
                  else {
                    aVar6 = (anon_union_8_2_743a5d44_for_Reason_0)sat.reason.data[uVar9].field_0._a;
                    uVar15 = aVar6._0_4_ & 3;
                    if ((aVar6._a & 3) != 0) {
                      if (uVar15 == 1) {
                        SAT::btToPos(&sat,sat.index,sat.trailpos.data[uVar9]);
                        aVar6._pt = SAT::_getExpl(&sat,LVar1);
                      }
                      else {
                        *(uint *)sat.short_expl = uVar15 << 8 | (uint)*(byte *)sat.short_expl;
                        *(uint *)(pCVar4 + 1) = *(uint *)&pRVar3[uVar9].field_0 >> 2;
                        aVar6._pt = sat.short_expl;
                        if (uVar15 == 3) {
                          pCVar4[1].data[0].x = *(int *)((long)&pRVar3[uVar9].field_0 + 4);
                          aVar6._pt = sat.short_expl;
                        }
                      }
                    }
                    if (aVar6._pt == (Clause *)0x0) {
LAB_001b6fb0:
                      local_7c.x = local_80.x ^ 1;
                      this_00 = &local_68;
                      elem = &local_7c;
                    }
                    else {
                      if (0x1ff < *(uint *)aVar6._pt) {
                        lVar12 = 0;
                        do {
                          if ((sat.seen.data[(uint)((int)((uint *)(aVar6._a + 8))[lVar12] >> 1)] &
                              1U) == 0) goto LAB_001b6fb0;
                          lVar12 = lVar12 + 1;
                        } while ((ulong)(*(uint *)aVar6._pt >> 8) - 1 != lVar12);
                      }
                      this_00 = (vec<Lit> *)local_78;
                      elem = &local_80;
                    }
                    vec<Lit>::push(this_00,elem);
                    aVar6 = local_50;
                    if (iVar16 == 0) goto LAB_001b70bd;
                  }
                  local_50 = aVar6;
                  uVar11 = (ulong)(uint)sat.index;
                }
              } while ((int)uVar11 != 0);
            }
            uVar5 = local_40 - 1;
            SAT::btToLevel(&sat,(int)uVar5);
          }
LAB_001b70bd:
          if (local_78._0_4_ != 0) {
            uVar5 = 0;
            do {
              sat.seen.data[(uint)(pLStack_70[uVar5].x >> 1)] =
                   sat.seen.data[(uint)(pLStack_70[uVar5].x >> 1)] & 0xfe;
              uVar5 = uVar5 + 1;
            } while (uVar5 < ((ulong)local_78 & 0xffffffff));
          }
          if (local_68.sz != 0) {
            uVar5 = 0;
            do {
              sat.seen.data[(uint)(local_68.data[uVar5].x >> 1)] =
                   sat.seen.data[(uint)(local_68.data[uVar5].x >> 1)] & 0xfe;
              uVar5 = uVar5 + 1;
            } while (uVar5 < (local_68._0_8_ & 0xffffffff));
          }
        }
      }
    }
  }
  if (pLStack_70 != (Lit *)0x0) {
    free(pLStack_70);
  }
  this = local_38;
  if (local_68.sz != 0) {
    uVar5 = 0;
    do {
      local_78 = (undefined1  [8])&PTR_finished_0020bb98;
      pLStack_70 = (Lit *)(CONCAT35(pLStack_70._5_3_,
                                    CONCAT14((char)local_68.data[uVar5].x,
                                             local_68.data[uVar5].x >> 1)) & 0xffffff01ffffffff);
      vec<BoolView>::push(this,(BoolView *)local_78);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (local_68._0_8_ & 0xffffffff));
  }
  if (0 < (int)uVar13) {
    uVar5 = 0;
    do {
      sat.seen.data[(uint)(engine.assumptions.data[uVar5] >> 1)] = '\x02';
      uVar5 = uVar5 + 1;
    } while (uVar14 != uVar5);
  }
  if (local_68.data != (Lit *)0x0) {
    free(local_68.data);
  }
  return;
}

Assistant:

void Engine::retrieve_assumption_nogood(vec<BoolView>& xs) {
	vec<Lit> out_nogood;
	const int assump_sz = sat.decisionLevel();
	assert(assump_sz < static_cast<int>(engine.assumptions.size()));

	const Lit q(toLit(engine.assumptions[assump_sz]));
	assert(sat.value(q) == l_False);

	// Mark the available assumptions
	for (int ii = 0; ii < assump_sz; ii++) {
		assert(sat.value(toLit(engine.assumptions[ii])) == l_True);
		sat.seen[engine.assumptions[ii] >> 1] = 2;
	}

	// Collect the nogood.
	// pushback_reason([](Lit p) { return sat.seen[var(p)]&2; }, q, out_nogood);
	pushback_reason_lazy([](Lit p) { return sat.seen[var(p)] & 2; }, q, out_nogood);

	for (unsigned int ii = 0; ii < out_nogood.size(); ii++) {
		xs.push(out_nogood[ii]);
	}

	// Finally, clear the marked assumptions
	for (int ii = 0; ii < assump_sz; ii++) {
		sat.seen[engine.assumptions[ii] >> 1] = 2;
	}
}